

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# level.c
# Opt level: O1

void ScaleAndAddObjects(Level *Lvl)

{
  Object *NewObject;
  double dVar1;
  double dVar2;
  double dVar3;
  
  for (NewObject = Lvl->AllObjects; NewObject != (Object *)0x0; NewObject = NewObject->Next) {
    dVar3 = (double)NewObject->ObjType->Radius;
    dVar1 = NewObject->Pos[0];
    dVar2 = NewObject->Pos[1];
    (NewObject->Bounder).BR.Pos[0] = dVar1 + dVar3;
    (NewObject->Bounder).BR.Pos[1] = dVar2 + dVar3;
    (NewObject->Bounder).TL.Pos[0] = dVar1 - dVar3;
    (NewObject->Bounder).TL.Pos[1] = dVar2 - dVar3;
    AddObject(Lvl,NewObject,0);
    AddObject(Lvl,NewObject,1);
  }
  return;
}

Assistant:

static void ScaleAndAddObjects(struct Level *Lvl)
{
   struct Object *O = Lvl->AllObjects;
   //double Scaler = (float)screen_height / 480.0f;

   while (O) {
      /* generate bounding box for collisions (i.e. no scaling yet) */
      O->Bounder.BR.Pos[0] = O->Pos[0] + O->ObjType->Radius;
      O->Bounder.BR.Pos[1] = O->Pos[1] + O->ObjType->Radius;
      O->Bounder.TL.Pos[0] = O->Pos[0] - O->ObjType->Radius;
      O->Bounder.TL.Pos[1] = O->Pos[1] - O->ObjType->Radius;

      /* insert into collisions tree */
      AddObject(Lvl, O, false);

      /* scale bounding box to get visual position */
      /*O->Bounder.BR.Pos[0] *= Scaler;
      O->Bounder.BR.Pos[1] *= Scaler;
      O->Bounder.TL.Pos[0] *= Scaler;
      O->Bounder.TL.Pos[1] *= Scaler;*/

      /* insert into display tree */
      AddObject(Lvl, O, true);

      /* move along linked lists */
      O = O->Next;
   }
}